

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomFourAction.cpp
# Opt level: O3

ActionResults * __thiscall GreenRoomFourAction::Go(GreenRoomFourAction *this)

{
  itemLocation iVar1;
  itemType iVar2;
  ItemWrapper *this_00;
  ActionResults *this_01;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  itemType local_e4;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_e4 = KID;
  this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_e4);
  iVar1 = ItemWrapper::getLocation(this_00);
  if (iVar1 == HIDDEN) {
    this_01 = (ActionResults *)operator_new(0x30);
    paVar4 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "You find yourself in the keyroom again. Your Green Key is goneand you can not go through the door again."
               ,"");
    ActionResults::ActionResults(this_01,THREE_KEY_ROOM,&local_40);
    _Var3._M_p = local_40._M_dataplus._M_p;
  }
  else {
    iVar2 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar2 == NORTH) {
      this_01 = (ActionResults *)operator_new(0x30);
      paVar4 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"You can\'t go north, you can only go south.\n","");
      ActionResults::ActionResults(this_01,CURRENT,&local_60);
      _Var3._M_p = local_60._M_dataplus._M_p;
    }
    else {
      iVar2 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      if (iVar2 == SOUTH) {
        this_01 = (ActionResults *)operator_new(0x30);
        paVar4 = &local_80.field_2;
        local_80._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"You go back to green room.\n","");
        ActionResults::ActionResults(this_01,G_ROOM2_BUCKET,&local_80);
        _Var3._M_p = local_80._M_dataplus._M_p;
      }
      else {
        iVar2 = Command::getMainItem((this->super_AbstractRoomAction).commands);
        if (iVar2 == EAST) {
          this_01 = (ActionResults *)operator_new(0x30);
          paVar4 = &local_a0.field_2;
          local_a0._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"You can\'t go west, you can only go south..\n","");
          ActionResults::ActionResults(this_01,CURRENT,&local_a0);
          _Var3._M_p = local_a0._M_dataplus._M_p;
        }
        else {
          iVar2 = Command::getMainItem((this->super_AbstractRoomAction).commands);
          this_01 = (ActionResults *)operator_new(0x30);
          if (iVar2 == WEST) {
            paVar4 = &local_c0.field_2;
            local_c0._M_dataplus._M_p = (pointer)paVar4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,"You can\'t go west, you can only go south..\n","");
            ActionResults::ActionResults(this_01,CURRENT,&local_c0);
            _Var3._M_p = local_c0._M_dataplus._M_p;
          }
          else {
            paVar4 = &local_e0.field_2;
            local_e0._M_dataplus._M_p = (pointer)paVar4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"You can\'t go there.\n","");
            ActionResults::ActionResults(this_01,CURRENT,&local_e0);
            _Var3._M_p = local_e0._M_dataplus._M_p;
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
  return this_01;
}

Assistant:

ActionResults * GreenRoomFourAction::Go() {

    if(itemList->getValue(KID)->getLocation() == HIDDEN) {
        return new ActionResults(THREE_KEY_ROOM, "You find yourself in the keyroom again. Your Green Key is gone"
                "and you can not go through the door again.");
    }
    if (commands->getMainItem() == NORTH) {
        return new ActionResults(CURRENT, "You can't go north, you can only go south.\n");
    }
    if (commands->getMainItem() == SOUTH) {
        return new ActionResults(G_ROOM2_BUCKET, "You go back to green room.\n");
    }
    if (commands->getMainItem() == EAST) {
        return new ActionResults(CURRENT, "You can't go west, you can only go south..\n");
    }
    if (commands->getMainItem() == WEST) {
        return new ActionResults(CURRENT, "You can't go west, you can only go south..\n");
    }
    return new ActionResults(CURRENT,"You can't go there.\n");

}